

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void * nk_command_buffer_push(nk_command_buffer *b,nk_command_type t,nk_size size)

{
  nk_buffer *pnVar1;
  nk_command_type *pnVar2;
  undefined8 uVar3;
  
  if (b->base != (nk_buffer *)0x0) {
    pnVar2 = (nk_command_type *)nk_buffer_alloc(b->base,NK_BUFFER_FRONT,size,8);
    if (pnVar2 != (nk_command_type *)0x0) {
      pnVar1 = b->base;
      b->last = (long)pnVar2 - (long)(pnVar1->memory).ptr;
      *pnVar2 = t;
      uVar3 = (((long)pnVar2 + size + 7 & 0xfffffffffffffff8) - ((long)pnVar2 + size)) +
              pnVar1->allocated;
      *(undefined8 *)(pnVar2 + 2) = uVar3;
      b->end = uVar3;
    }
    return pnVar2;
  }
  __assert_fail("b->base",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1c86,
                "void *nk_command_buffer_push(struct nk_command_buffer *, enum nk_command_type, nk_size)"
               );
}

Assistant:

NK_INTERN void*
nk_command_buffer_push(struct nk_command_buffer* b,
    enum nk_command_type t, nk_size size)
{
    NK_STORAGE const nk_size align = NK_ALIGNOF(struct nk_command);
    struct nk_command *cmd;
    nk_size alignment;
    void *unaligned;
    void *memory;

    NK_ASSERT(b);
    NK_ASSERT(b->base);
    if (!b) return 0;
    cmd = (struct nk_command*)nk_buffer_alloc(b->base,NK_BUFFER_FRONT,size,align);
    if (!cmd) return 0;

    /* make sure the offset to the next command is aligned */
    b->last = (nk_size)((nk_byte*)cmd - (nk_byte*)b->base->memory.ptr);
    unaligned = (nk_byte*)cmd + size;
    memory = NK_ALIGN_PTR(unaligned, align);
    alignment = (nk_size)((nk_byte*)memory - (nk_byte*)unaligned);
#ifdef NK_ZERO_COMMAND_MEMORY
    NK_MEMSET(cmd, 0, size + alignment);
#endif

    cmd->type = t;
    cmd->next = b->base->allocated + alignment;
#ifdef NK_INCLUDE_COMMAND_USERDATA
    cmd->userdata = b->userdata;
#endif
    b->end = cmd->next;
    return cmd;
}